

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O2

void enlarge_ntuple_list(ntuple_list n_tuple)

{
  uint uVar1;
  double *pdVar2;
  
  if (((n_tuple != (ntuple_list)0x0) && (n_tuple->values != (double *)0x0)) &&
     (n_tuple->max_size != 0)) {
    uVar1 = n_tuple->max_size * 2;
    n_tuple->max_size = uVar1;
    pdVar2 = (double *)realloc(n_tuple->values,(ulong)(uVar1 * n_tuple->dim) << 3);
    n_tuple->values = pdVar2;
    if (pdVar2 != (double *)0x0) {
      return;
    }
    error("not enough memory.");
  }
  error("enlarge_ntuple_list: invalid n-tuple.");
}

Assistant:

void enlarge_ntuple_list(ntuple_list n_tuple)
{
    /* check parameters */
    if ( n_tuple == NULL || n_tuple->values == NULL || n_tuple->max_size == 0 )
        error("enlarge_ntuple_list: invalid n-tuple.");

    /* duplicate number of tuples */
    n_tuple->max_size *= 2;

    /* realloc memory */
    n_tuple->values = (double *) realloc( (void *) n_tuple->values,
                                          n_tuple->dim * n_tuple->max_size * sizeof(double) );
    if ( n_tuple->values == NULL ) error("not enough memory.");
}